

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f __thiscall Quat4f::randomRotation(Quat4f *this,float u0,float u1,float u2)

{
  float fVar1;
  float x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qa;
  ulong uVar7;
  Quat4f QVar8;
  float w;
  float r;
  float theta;
  float z;
  float u2_local;
  float u1_local;
  float u0_local;
  
  dVar2 = sqrt((double)(-u0 * u0 + 1.0));
  fVar1 = u2 * 3.1415927;
  dVar3 = cos((double)fVar1);
  dVar4 = sin((double)fVar1);
  dVar5 = cos((double)(u1 * 6.2831855));
  x = (float)(dVar4 * dVar5 * (double)(float)dVar2);
  dVar4 = sin((double)fVar1);
  dVar5 = sin((double)(u1 * 6.2831855));
  dVar6 = sin((double)fVar1);
  uVar7 = (ulong)(uint)x;
  Quat4f(this,(float)dVar3,x,(float)(dVar4 * dVar5 * (double)(float)dVar2),
         (float)(dVar6 * (double)u0));
  QVar8.m_elements[2] = (float)(int)uVar7;
  QVar8.m_elements[3] = (float)(int)(uVar7 >> 0x20);
  QVar8.m_elements[0] = (float)(int)extraout_XMM0_Qa;
  QVar8.m_elements[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Quat4f)QVar8.m_elements;
}

Assistant:

Quat4f Quat4f::randomRotation( float u0, float u1, float u2 )
{
	float z = u0;
	float theta = static_cast< float >( 2.f * M_PI * u1 );
	float r = sqrt( 1.f - z * z );
	float w = static_cast< float >( M_PI * u2 );

	return Quat4f
	(
		cos( w ),
		sin( w ) * cos( theta ) * r,
		sin( w ) * sin( theta ) * r,
		sin( w ) * z
	);
}